

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  shared_ptr<Catch::TestCaseTracking::ITracker> local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  NameAndLocation local_70;
  undefined1 local_40 [8];
  ITrackerPtr childTracker;
  ITracker *currentTracker;
  shared_ptr<Catch::TestCaseTracking::SectionTracker> section;
  NameAndLocation *nameAndLocation_local;
  TrackerContext *ctx_local;
  
  section.super___shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)nameAndLocation;
  clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&currentTracker);
  childTracker.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TrackerContext::currentTracker(ctx);
  (*((ITracker *)
    childTracker.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi)->_vptr_ITracker[0xc])
            (local_40,childTracker.
                      super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,
             section.
             super___shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if (bVar2) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
    if (!bVar2) {
      __assert_fail("childTracker",
                    "/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp"
                    ,0x38ca,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const NameAndLocation &)"
                   );
    }
    peVar4 = clara::std::
             __shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    uVar3 = (*peVar4->_vptr_ITracker[0xe])();
    if ((uVar3 & 1) == 0) {
      __assert_fail("childTracker->isSectionTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp"
                    ,0x38cb,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const NameAndLocation &)"
                   );
    }
    std::
    static_pointer_cast<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::ITracker>
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)&local_70.name.field_2);
    clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::operator=
              ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&currentTracker,
               (shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&local_70.name.field_2);
    clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&local_70.name.field_2);
  }
  else {
    local_78 = childTracker.
               super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    std::
    make_shared<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              (&local_70,
               (TrackerContext *)
               section.
               super___shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,(ITracker **)ctx);
    clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::operator=
              ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&currentTracker,
               (shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&local_70);
    clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&local_70);
    _Var1 = childTracker.
            super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    std::shared_ptr<Catch::TestCaseTracking::ITracker>::
    shared_ptr<Catch::TestCaseTracking::SectionTracker,void>
              (&local_88,(shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&currentTracker);
    (*(_Var1._M_pi)->_vptr__Sp_counted_base[0xb])(_Var1._M_pi,&local_88);
    clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr(&local_88);
  }
  clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::ITracker> *)local_40);
  bVar2 = TrackerContext::completedCycle(ctx);
  if (!bVar2) {
    peVar5 = clara::std::
             __shared_ptr_access<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&currentTracker);
    tryOpen(peVar5);
  }
  peVar5 = clara::std::
           __shared_ptr_access<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&currentTracker);
  clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)&currentTracker);
  return peVar5;
}

Assistant:

SectionTracker& SectionTracker::acquire( TrackerContext& ctx, NameAndLocation const& nameAndLocation ) {
        std::shared_ptr<SectionTracker> section;

        ITracker& currentTracker = ctx.currentTracker();
        if( ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
            assert( childTracker );
            assert( childTracker->isSectionTracker() );
            section = std::static_pointer_cast<SectionTracker>( childTracker );
        }
        else {
            section = std::make_shared<SectionTracker>( nameAndLocation, ctx, &currentTracker );
            currentTracker.addChild( section );
        }
        if( !ctx.completedCycle() )
            section->tryOpen();
        return *section;
    }